

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.cpp
# Opt level: O2

bool __thiscall stick::Error::operator==(Error *this,Error *_other)

{
  undefined1 local_d0 [8];
  Error a;
  Error b;
  
  (*this->m_category->_vptr_ErrorCategory[2])((Error *)local_d0,this->m_category,this);
  (*_other->m_category->_vptr_ErrorCategory[2])(&a.m_line,_other->m_category,_other);
  ~Error((Error *)&a.m_line);
  ~Error((Error *)local_d0);
  return local_d0 == (undefined1  [8])a._80_8_ && (int)a.m_category == (int)b.m_category;
}

Assistant:

bool Error::operator==(const Error & _other) const
{
    Error a = resolvedCode();
    Error b = _other.resolvedCode();
    return a.m_code == b.m_code && a.m_category == b.m_category;
}